

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.hpp
# Opt level: O2

size_t interpolative_internal::encode(uint32_t *f,uint32_t *in_buf,size_t n,size_t u)

{
  bit_stream local_50;
  
  local_50.first_ptr = local_50.buf;
  local_50.last_ptr = local_50.buf + 1;
  local_50.write_mode = true;
  local_50.in_word_offset = '\0';
  local_50.bytes_written = 0;
  local_50.bytes_consumed = 0;
  local_50.of = f;
  local_50.cur_ptr = local_50.first_ptr;
  encode_interpolative(&local_50,in_buf,n,1,u + 1);
  if ((local_50.write_mode == true) && (local_50.in_word_offset != '\0')) {
    local_50.bytes_written = local_50.bytes_written + 4;
    *local_50.of = *local_50.first_ptr;
  }
  return local_50.bytes_written;
}

Assistant:

static inline size_t encode(
        uint32_t* f, const uint32_t* in_buf, size_t n, size_t u)
    {
        bit_stream os(f, true);
        size_t low = 1;
        size_t high = u + 1;
        encode_interpolative(os, in_buf, n, low, high);
        return os.flush();
    }